

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 sqlite3LogEstToInt(LogEst x)

{
  char cVar1;
  undefined8 local_20;
  undefined8 local_18;
  u64 n;
  LogEst x_local;
  
  local_18 = (ulong)((int)x % 10);
  if (local_18 < 5) {
    if (local_18 != 0) {
      local_18 = local_18 - 1;
    }
  }
  else {
    local_18 = local_18 - 2;
  }
  cVar1 = (char)(x / 10);
  if (x / 10 < 3) {
    local_20 = local_18 + 8 >> (3U - cVar1 & 0x3f);
  }
  else {
    local_20 = local_18 + 8 << (cVar1 - 3U & 0x3f);
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || \
    defined(SQLITE_EXPLAIN_ESTIMATED_ROWS)
  if( x>60 ) return (u64)LARGEST_INT64;
#else
  /* If only SQLITE_ENABLE_STAT3_OR_STAT4 is on, then the largest input
  ** possible to this routine is 310, resulting in a maximum x of 31 */
  assert( x<=60 );
#endif
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}